

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

JointObservation * __thiscall
TransitionObservationIndependentMADPDiscrete::GetJointObservation
          (TransitionObservationIndependentMADPDiscrete *this,Index i)

{
  pointer ppJVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  JointObservationDiscrete *this_00;
  ulong uVar4;
  ObservationDiscrete *a;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  uint agentI;
  ulong uVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  pair<unsigned_int,_JointObservationDiscrete_*> local_38;
  
  if (this->_m_jointIndicesCached == true) {
    ppJVar1 = (this->_m_jointObs).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_jointObs).
                      super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3) <= (ulong)i)
    {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    this_00 = ppJVar1[i];
  }
  else {
    p_Var3 = &(this->_m_jointObsMap->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = (this->_m_jointObsMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = p_Var3;
    for (p_Var6 = p_Var2; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar8]) {
      bVar8 = p_Var6[1]._M_color < i;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = p_Var3;
    if ((p_Var5 != p_Var3) && (p_Var6 = p_Var5, i < p_Var5[1]._M_color)) {
      p_Var6 = p_Var3;
    }
    p_Var5 = p_Var3;
    if (p_Var6 == p_Var3) {
      this_00 = (JointObservationDiscrete *)operator_new(0x48);
      JointObservationDiscrete::JointObservationDiscrete(this_00,i);
      IndexTools::JointToIndividualIndices(&local_50,i,&this->_m_nrIndivObs);
      agentI = 0;
      while( true ) {
        uVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
        uVar7 = (ulong)agentI;
        if (uVar4 <= uVar7) break;
        a = MADPComponentDiscreteObservations::GetObservationDiscrete
                      (&(this->_m_individualMADPDs).
                        super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->_m_O,0,
                       local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar7]);
        JointObservationDiscrete::AddIndividualObservation(this_00,a,agentI);
        agentI = agentI + 1;
      }
      local_38.first = i;
      local_38.second = this_00;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,JointObservationDiscrete*>,std::_Select1st<std::pair<unsigned_int_const,JointObservationDiscrete*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,JointObservationDiscrete*>>>
      ::_M_emplace_unique<std::pair<unsigned_int,JointObservationDiscrete*>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,JointObservationDiscrete*>,std::_Select1st<std::pair<unsigned_int_const,JointObservationDiscrete*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,JointObservationDiscrete*>>>
                  *)this->_m_jointObsMap,&local_38);
      if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar8]) {
        bVar8 = p_Var2[1]._M_color < i;
        if (!bVar8) {
          p_Var5 = p_Var2;
        }
      }
      if ((p_Var5 != p_Var3) && (p_Var5[1]._M_color <= i)) {
        p_Var3 = p_Var5;
      }
      this_00 = (JointObservationDiscrete *)p_Var3[1]._M_parent;
    }
  }
  return &this_00->super_JointObservation;
}

Assistant:

const JointObservation* 
TransitionObservationIndependentMADPDiscrete::GetJointObservation(Index i) const
{
    if(_m_jointIndicesCached) // we cached all joint obs
        return(_m_jointObs.at(i));
    // we cached the ones already asked for
    else if(_m_jointObsMap->find(i)!=_m_jointObsMap->end())
        return(_m_jointObsMap->find(i)->second);
    else // create new joint obs and add it to cache
    {
        JointObservationDiscrete *observation=new JointObservationDiscrete(i);
        vector<Index> ind_sI=
            IndexTools::JointToIndividualIndices(i,_m_nrIndivObs);
        for(Index agI = 0; agI < GetNrAgents(); agI++)
            observation->AddIndividualObservation(
                GetIndividualMADPD(agI)->GetObservationDiscrete(0,ind_sI[agI]),
                agI);
        
        _m_jointObsMap->insert(make_pair(i,observation));
        return(observation);
    }
}